

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

DisasJumpType op_bcth(DisasContext_conflict13 *s,DisasOps *o)

{
  uint uVar1;
  int iVar2;
  int imm;
  TCGContext_conflict12 *s_00;
  DisasJumpType DVar3;
  TCGTemp *ts;
  TCGTemp *pTVar4;
  TCGv_i64 ret;
  DisasCompare_conflict2 c;
  DisasCompare_conflict2 local_48;
  
  uVar1 = (s->fields).presentO;
  if (((uVar1 & 1) != 0) && ((uVar1 >> 0x12 & 1) != 0)) {
    s_00 = s->uc->tcg_ctx;
    iVar2 = (s->fields).c[0];
    imm = (s->fields).c[1];
    local_48._0_1_ = 9;
    local_48.is_64 = false;
    local_48.g1 = false;
    local_48.g2 = false;
    ts = tcg_temp_new_internal_s390x(s_00,TCG_TYPE_I64,false);
    ret = (TCGv_i64)((long)ts - (long)s_00);
    tcg_gen_shri_i64_s390x(s_00,ret,s_00->regs[iVar2],0x20);
    tcg_gen_subi_i64_s390x(s_00,ret,ret,1);
    tcg_gen_deposit_i64_s390x(s_00,s_00->regs[iVar2],s_00->regs[iVar2],ret,0x20,0x20);
    pTVar4 = tcg_temp_new_internal_s390x(s_00,TCG_TYPE_I32,false);
    local_48.u.s32.a = (TCGv_i32)((long)pTVar4 - (long)s_00);
    local_48.u.s32.b = tcg_const_i32_s390x(s_00,0);
    tcg_gen_extrl_i64_i32_s390x(s_00,(TCGv_i32)((long)pTVar4 - (long)s_00),ret);
    tcg_temp_free_internal_s390x(s_00,ts);
    DVar3 = help_branch(s,&local_48,true,imm,o->in2);
    return DVar3;
  }
  __assert_fail("have_field1(s, o)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                ,0x44d,
                "int get_field1(const DisasContext *, enum DisasFieldIndexO, enum DisasFieldIndexC)"
               );
}

Assistant:

static DisasJumpType op_bcth(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int r1 = get_field(s, r1);
    int imm = get_field(s, i2);
    DisasCompare c;
    TCGv_i64 t;

    c.cond = TCG_COND_NE;
    c.is_64 = false;
    c.g1 = false;
    c.g2 = false;

    t = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_shri_i64(tcg_ctx, t, tcg_ctx->regs[r1], 32);
    tcg_gen_subi_i64(tcg_ctx, t, t, 1);
    store_reg32h_i64(tcg_ctx, r1, t);
    c.u.s32.a = tcg_temp_new_i32(tcg_ctx);
    c.u.s32.b = tcg_const_i32(tcg_ctx, 0);
    tcg_gen_extrl_i64_i32(tcg_ctx, c.u.s32.a, t);
    tcg_temp_free_i64(tcg_ctx, t);

    return help_branch(s, &c, 1, imm, o->in2);
}